

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O3

void JSONWorker::NewNode(internalJSONNode *parent,json_string *name,json_string *value,bool array)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  json_string *pjVar2;
  size_t sVar3;
  internalJSONNode *internal_t;
  JSONNode *this;
  char *pcVar4;
  undefined7 in_register_00000009;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  json_string _comment;
  json_string local_88;
  char *local_68;
  char *local_60;
  long local_58;
  json_string local_50;
  
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  pjVar2 = name;
  if ((int)CONCAT71(in_register_00000009,array) != 0) {
    pjVar2 = value;
  }
  local_50.field_2._M_local_buf[0] = '\0';
  pcVar6 = (pjVar2->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if (*pcVar6 == '#') {
    local_60 = pcVar6 + value->_M_string_length;
    pcVar4 = pcVar6;
    while( true ) {
      pcVar6 = local_68;
      if (pcVar4[1] != '#') {
        pcVar7 = pcVar4 + 1;
        lVar5 = 0;
        pcVar6 = pcVar7;
        do {
          local_68 = pcVar6;
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          local_58 = lVar5;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"Removing white space failed","");
          JSONDebug::_JSON_ASSERT(local_68 != local_60,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          lVar5 = local_58 + -1;
          pcVar6 = local_68 + 1;
        } while (local_68[1] != '#');
        pcVar4 = local_68;
        if (lVar5 != 0) {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar7);
          std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_88._M_dataplus._M_p);
          pcVar4 = local_68;
          pcVar6 = local_68;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
            pcVar4 = local_68;
            pcVar6 = local_68;
          }
        }
      }
      local_68 = pcVar6;
      pcVar6 = pcVar4 + 2;
      if (pcVar4[2] != '#') break;
      std::__cxx11::string::push_back((char)&local_50);
      pcVar4 = pcVar6;
    }
  }
  if (array) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    sVar3 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar6,pcVar6 + sVar3);
    internal_t = internalJSONNode::newInternal(name,&local_88);
  }
  else {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    sVar3 = strlen(pcVar6 + 1);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,pcVar6 + 1,pcVar6 + sVar3 + 1);
    internal_t = internalJSONNode::newInternal(&local_88,value);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  this = ::JSONNode::newJSONNode(internal_t);
  ::JSONNode::set_comment(this,&local_50);
  jsonChildren::push_back(parent->Children,this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

inline void JSONWorker::NewNode(const internalJSONNode * parent, const json_string & name, const json_string & value, ARRAY_PARAM) json_nothrow {
    #ifdef JSON_COMMENTS
	   JSONNode * child;
	   START_MEM_SCOPE
		  json_string _comment;
		  START_MEM_SCOPE
			 const json_char * runner = ((array) ? value.data() : name.data());
			 #ifdef JSON_DEBUG
				const json_char * const end = runner + value.length();
			#endif
			 if (json_unlikely(*runner == JSON_TEMP_COMMENT_IDENTIFIER)){  //multiple comments will be consolidated into one
				size_t count;
				const json_char * start;
			    newcomment:
				count = 0;
				start = runner + 1;
				while(*(++runner) != JSON_TEMP_COMMENT_IDENTIFIER){
				    JSON_ASSERT(runner != end, JSON_TEXT("Removing white space failed"));
					++count;
				}
				if (count) _comment += json_string(start, count);
				if (json_unlikely(*(++runner) == JSON_TEMP_COMMENT_IDENTIFIER)){ //step past the trailing tag
				    _comment += JSON_TEXT('\n');
				    goto newcomment;
				}
			 }
			 internalJSONNode * myinternal;
			 if (array){
				myinternal = internalJSONNode::newInternal(name, runner);
			 } else {
				myinternal = internalJSONNode::newInternal(++runner, value);
			 }
			 child = JSONNode::newJSONNode(myinternal);
		  END_MEM_SCOPE
		  child -> set_comment(_comment);
	   END_MEM_SCOPE
	   const_cast<internalJSONNode*>(parent) -> CHILDREN -> push_back(child);   //attach it to the parent node
    #else
	if (name.empty()){
	   	const_cast<internalJSONNode*>(parent) -> CHILDREN -> push_back(JSONNode::newJSONNode(internalJSONNode::newInternal(name, value)));	    //attach it to the parent node
	} else {
		const_cast<internalJSONNode*>(parent) -> CHILDREN -> push_back(JSONNode::newJSONNode(internalJSONNode::newInternal(json_string(name.begin() + 1, name.end()), value)));	    //attach it to the parent node
	}
    #endif
}